

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttpthreaddelegate.cpp
# Opt level: O2

void __thiscall QHttpThreadDelegate::headerChangedSlot(QHttpThreadDelegate *this)

{
  qsizetype qVar1;
  Data *pDVar2;
  bool bVar3;
  QHttpThreadDelegate QVar4;
  QHttpThreadDelegate QVar5;
  int iVar6;
  long lVar7;
  ulong uVar8;
  Data *pDVar9;
  undefined8 uVar10;
  qint64 qVar11;
  QHttpNetworkReply *this_00;
  long in_FS_OFFSET;
  undefined4 in_stack_ffffffffffffff9c;
  QArrayDataPointer<char16_t> local_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QHttpNetworkReply **)(this + 0x150);
  if (this_00 != (QHttpNetworkReply *)0x0) {
    if (this[0x10] == (QHttpThreadDelegate)0x1) {
      QHttpNetworkReply::sslConfiguration((QHttpNetworkReply *)&local_48);
      sslConfigurationChanged(this,(QSslConfiguration *)&local_48);
      QSslConfiguration::~QSslConfiguration((QSslConfiguration *)&local_48);
      this_00 = *(QHttpNetworkReply **)(this + 0x150);
    }
    bVar3 = QHttpNetworkReply::supportsUserProvidedDownloadBuffer(this_00);
    if ((bVar3) && (0 < *(long *)(this + 0x30))) {
      lVar7 = (**(code **)(**(long **)(this + 0x150) + 0x80))();
      if (lVar7 <= *(long *)(this + 0x30)) {
        uVar8 = (**(code **)(**(long **)(this + 0x150) + 0x80))();
        pDVar9 = (Data *)operator_new__(uVar8,(nothrow_t *)&std::nothrow);
        if (pDVar9 != (Data *)0x0) {
          local_48.d = pDVar9;
          local_48.ptr = (char16_t *)operator_new(0x20);
          ((Data *)((long)local_48.ptr + 0x10))->destroyer = (DestroyerFn)pDVar9;
          ((Data *)local_48.ptr)->destroyer =
               QtSharedPointer::
               ExternalRefCountWithCustomDeleter<char,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qt[P]qtbase/src/network/access/qhttpthreaddelegate.cpp:613:56)>
               ::deleter;
          (((Data *)local_48.ptr)->strongref)._q_value.super___atomic_base<int>._M_i = 1;
          (((Data *)local_48.ptr)->weakref)._q_value.super___atomic_base<int>._M_i = 1;
          QSharedPointer<char>::operator=
                    ((QSharedPointer<char> *)(this + 0x120),(QSharedPointer<char> *)&local_48);
          QSharedPointer<char>::deref((Data *)local_48.ptr);
          QHttpNetworkReply::setUserProvidedDownloadBuffer
                    (*(QHttpNetworkReply **)(this + 0x150),(char *)pDVar9);
        }
      }
    }
    (**(code **)(**(long **)(this + 0x150) + 0x90))(&local_48);
    pDVar9 = *(Data **)(this + 0xb0);
    *(Data **)(this + 0xb0) = local_48.d;
    local_48.d = pDVar9;
    QHttpHeaders::~QHttpHeaders((QHttpHeaders *)&local_48);
    iVar6 = QHttpNetworkReply::statusCode(*(QHttpNetworkReply **)(this + 0x150));
    *(int *)(this + 0xb8) = iVar6;
    QHttpNetworkReply::reasonPhrase((QString *)&local_48,*(QHttpNetworkReply **)(this + 0x150));
    pDVar9 = *(Data **)(this + 0xc0);
    pDVar2 = *(Data **)(this + 200);
    *(Data **)(this + 0xc0) = local_48.d;
    *(char16_t **)(this + 200) = local_48.ptr;
    qVar1 = *(qsizetype *)(this + 0xd0);
    *(qsizetype *)(this + 0xd0) = local_48.size;
    local_48.d = pDVar9;
    local_48.ptr = (char16_t *)pDVar2;
    local_48.size = qVar1;
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_48);
    QVar4 = (QHttpThreadDelegate)
            QHttpNetworkReply::isPipeliningUsed(*(QHttpNetworkReply **)(this + 0x150));
    this[0xd8] = QVar4;
    uVar10 = (**(code **)(**(long **)(this + 0x150) + 0x80))();
    *(undefined8 *)(this + 0xe0) = uVar10;
    qVar11 = QHttpNetworkReply::removedContentLength(*(QHttpNetworkReply **)(this + 0x150));
    *(qint64 *)(this + 0xe8) = qVar11;
    QVar4 = (QHttpThreadDelegate)
            QHttpNetworkReply::isHttp2Used(*(QHttpNetworkReply **)(this + 0x150));
    this[0xd9] = QVar4;
    QVar5 = (QHttpThreadDelegate)
            QHttpNetworkReply::isCompressed(*(QHttpNetworkReply **)(this + 0x150));
    this[0xda] = QVar5;
    iVar6 = *(int *)(this + 0xb8);
    QVar4 = this[0xd8];
    uVar10 = *(undefined8 *)(this + 0x120);
    pDVar2 = *(Data **)(this + 0x128);
    if (pDVar2 != (Data *)0x0) {
      LOCK();
      (pDVar2->weakref)._q_value.super___atomic_base<int>._M_i =
           (pDVar2->weakref)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
      LOCK();
      (pDVar2->strongref)._q_value.super___atomic_base<int>._M_i =
           (pDVar2->strongref)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
      QVar5 = this[0xda];
    }
    downloadMetaData(this,(QHttpHeaders *)(this + 0xb0),iVar6,(QString *)(this + 0xc0),(bool)QVar4,
                     *(QSharedPointer<char> *)(this + 0xe0),(qint64)&stack0xffffffffffffffa8,
                     CONCAT44(in_stack_ffffffffffffff9c,(uint)(byte)this[0xd9]),
                     (bool)((byte)QVar5 & 1),SUB81(uVar10,0));
    QSharedPointer<char>::deref(pDVar2);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QHttpThreadDelegate::headerChangedSlot()
{
    if (!httpReply)
        return;

#ifdef QHTTPTHREADDELEGATE_DEBUG
    qDebug() << "QHttpThreadDelegate::headerChangedSlot() thread=" << QThread::currentThreadId();
#endif

#ifndef QT_NO_SSL
    if (ssl)
        emit sslConfigurationChanged(httpReply->sslConfiguration());
#endif

    // Is using a zerocopy buffer allowed by user and possible with this reply?
    if (httpReply->supportsUserProvidedDownloadBuffer()
        && (downloadBufferMaximumSize > 0) && (httpReply->contentLength() <= downloadBufferMaximumSize)) {
        char *buf = new (std::nothrow) char[httpReply->contentLength()];
        // in out of memory situations, don't use downloadBuffer.
        if (buf) {
            downloadBuffer = QSharedPointer<char>(buf, [](auto p) { delete[] p; });
            httpReply->setUserProvidedDownloadBuffer(buf);
        }
    }

    // We fetch this into our own
    incomingHeaders = httpReply->header();
    incomingStatusCode = httpReply->statusCode();
    incomingReasonPhrase = httpReply->reasonPhrase();
    isPipeliningUsed = httpReply->isPipeliningUsed();
    incomingContentLength = httpReply->contentLength();
    removedContentLength = httpReply->removedContentLength();
    isHttp2Used = httpReply->isHttp2Used();
    isCompressed = httpReply->isCompressed();

    emit downloadMetaData(incomingHeaders,
                          incomingStatusCode,
                          incomingReasonPhrase,
                          isPipeliningUsed,
                          downloadBuffer,
                          incomingContentLength,
                          removedContentLength,
                          isHttp2Used,
                          isCompressed);
}